

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O0

REF_STATUS ref_mpi_create_from_comm(REF_MPI *ref_mpi_ptr,void *comm_ptr)

{
  REF_MPI pRVar1;
  clock_t cVar2;
  clock_t ticks;
  REF_MPI ref_mpi;
  void *comm_ptr_local;
  REF_MPI *ref_mpi_ptr_local;
  
  pRVar1 = (REF_MPI)malloc(0x38);
  *ref_mpi_ptr = pRVar1;
  if (*ref_mpi_ptr == (REF_MPI)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x49,
           "ref_mpi_create_from_comm","malloc *ref_mpi_ptr of REF_MPI_STRUCT NULL");
    ref_mpi_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_mpi_ptr;
    pRVar1->id = 0;
    pRVar1->n = 1;
    pRVar1->max_tag = -1;
    pRVar1->comm = (void *)0x0;
    cVar2 = clock();
    pRVar1->first_time = (double)cVar2 / 1000000.0;
    pRVar1->start_time = pRVar1->first_time;
    pRVar1->native_alltoallv = 0;
    pRVar1->debug = 0;
    pRVar1->timing = 0;
    pRVar1->reduce_byte_limit = 1000000;
    ref_mpi_ptr_local._4_4_ = 0;
  }
  return ref_mpi_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_create_from_comm(REF_MPI *ref_mpi_ptr,
                                            void *comm_ptr) {
  REF_MPI ref_mpi;
  clock_t ticks;

  ref_malloc(*ref_mpi_ptr, 1, REF_MPI_STRUCT);
  ref_mpi = (*ref_mpi_ptr);

  ref_mpi->id = 0;
  ref_mpi->n = 1;
  ref_mpi->max_tag = REF_EMPTY;

  ref_mpi->comm = NULL;

  ticks = clock();
  ref_mpi->first_time = ((REF_DBL)ticks) / ((REF_DBL)CLOCKS_PER_SEC);
  ref_mpi->start_time = ref_mpi->first_time;

  ref_mpi->native_alltoallv = REF_FALSE;
  ref_mpi->debug = REF_FALSE;
  ref_mpi->timing = 0;
  /* just below 1MB threshold to prevent slowdown with MPT 2.23-2.25 */
  ref_mpi->reduce_byte_limit = 1000000;

#ifdef HAVE_MPI
  {
    int running;
    if (NULL != comm_ptr) {
      ref_malloc(ref_mpi->comm, 1, MPI_Comm);
      RNS(memcpy(ref_mpi->comm, comm_ptr, sizeof(MPI_Comm)), "copy comm");
    }
    REIS(MPI_SUCCESS, MPI_Initialized(&running), "running?");
    if (running) {
      int is_set;
      void *value;
      MPI_Comm_size(ref_mpi_comm(ref_mpi), &(ref_mpi->n));
      MPI_Comm_rank(ref_mpi_comm(ref_mpi), &(ref_mpi->id));
      value = NULL;
      REIS(MPI_SUCCESS,
           MPI_Comm_get_attr(MPI_COMM_WORLD, MPI_TAG_UB, &value, &is_set),
           "unable to query MPI environment MPI_TAG_UB from world comm");
      RAS(is_set, "MPI environment MPI_TAG_UB not set");
      RAS(value != NULL, "max tag pointer not set");
      ref_mpi->max_tag = *(int *)value;
      RAB(ref_mpi->max_tag >= 0, "max tag negative",
          { printf("max tag %d\n", ref_mpi->max_tag); });
    }
  }
  ref_mpi->first_time = (REF_DBL)MPI_Wtime();
  ref_mpi->start_time = ref_mpi->first_time;
#else
  SUPRESS_UNUSED_COMPILER_WARNING(comm_ptr);
#endif

  return REF_SUCCESS;
}